

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O3

void duckdb::MaxOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
               (MinMaxState<duckdb::interval_t> *state,interval_t input,AggregateInputData *param_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar2 = input.micros;
  lVar4 = input._0_8_;
  lVar5 = (lVar4 >> 0x20) + lVar2 / 86400000000;
  lVar3 = lVar5 % 0x1e;
  lVar1 = (state->value).micros;
  lVar7 = (long)input.months + lVar5 / 0x1e;
  lVar6 = (long)(state->value).days + lVar1 / 86400000000;
  lVar5 = lVar6 % 0x1e;
  lVar6 = (long)(state->value).months + lVar6 / 0x1e;
  if ((lVar6 < lVar7) ||
     ((lVar6 <= lVar7 &&
      ((lVar5 < lVar3 || ((lVar5 <= lVar3 && (lVar1 % 86400000000 < lVar2 % 86400000000)))))))) {
    (state->value).months = (int)lVar4;
    (state->value).days = (int)((ulong)lVar4 >> 0x20);
    (state->value).micros = lVar2;
  }
  return;
}

Assistant:

static void Execute(STATE &state, INPUT_TYPE input, AggregateInputData &) {
		if (GreaterThan::Operation<INPUT_TYPE>(input, state.value)) {
			state.value = input;
		}
	}